

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_read_file_(char *filename,char **content_out,size_t *len_out,int is_binary)

{
  int __fd;
  int iVar1;
  char *ptr;
  ssize_t sVar2;
  ulong uStack_d8;
  int mode;
  size_t read_so_far;
  char *mem;
  stat st;
  int r;
  int fd;
  int is_binary_local;
  size_t *len_out_local;
  char **content_out_local;
  char *filename_local;
  
  if (content_out == (char **)0x0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
               ,0x96,"content_out","evutil_read_file_");
  }
  if (len_out != (size_t *)0x0) {
    *content_out = (char *)0x0;
    *len_out = 0;
    __fd = evutil_open_closeonexec_(filename,0,0);
    if (__fd < 0) {
      filename_local._4_4_ = -1;
    }
    else {
      iVar1 = fstat(__fd,(stat *)&mem);
      if (((iVar1 == 0) && (-1 < (long)st.st_rdev)) && ((long)st.st_rdev < 0x7fffffffffffffff)) {
        ptr = (char *)event_mm_malloc_(st.st_rdev + 1);
        if (ptr == (char *)0x0) {
          close(__fd);
          filename_local._4_4_ = -2;
        }
        else {
          uStack_d8 = 0;
          while( true ) {
            sVar2 = read(__fd,ptr + uStack_d8,st.st_rdev - uStack_d8);
            st.__glibc_reserved[2]._4_4_ = (int)sVar2;
            if ((st.__glibc_reserved[2]._4_4_ < 1) ||
               (uStack_d8 = (long)st.__glibc_reserved[2]._4_4_ + uStack_d8, st.st_rdev <= uStack_d8)
               ) break;
            if (st.st_rdev <= uStack_d8) {
              event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
                         ,0xb7,"read_so_far < (size_t)st.st_size","evutil_read_file_");
            }
          }
          close(__fd);
          if (st.__glibc_reserved[2]._4_4_ < 0) {
            event_mm_free_(ptr);
            filename_local._4_4_ = -2;
          }
          else {
            ptr[uStack_d8] = '\0';
            *len_out = uStack_d8;
            *content_out = ptr;
            filename_local._4_4_ = 0;
          }
        }
      }
      else {
        close(__fd);
        filename_local._4_4_ = -2;
      }
    }
    return filename_local._4_4_;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
             ,0x97,"len_out","evutil_read_file_");
}

Assistant:

int
evutil_read_file_(const char *filename, char **content_out, size_t *len_out,
    int is_binary)
{
	int fd, r;
	struct stat st;
	char *mem;
	size_t read_so_far=0;
	int mode = O_RDONLY;

	EVUTIL_ASSERT(content_out);
	EVUTIL_ASSERT(len_out);
	*content_out = NULL;
	*len_out = 0;

#ifdef O_BINARY
	if (is_binary)
		mode |= O_BINARY;
#endif

	fd = evutil_open_closeonexec_(filename, mode, 0);
	if (fd < 0)
		return -1;
	if (fstat(fd, &st) || st.st_size < 0 ||
	    st.st_size > EV_SSIZE_MAX-1 ) {
		close(fd);
		return -2;
	}
	mem = mm_malloc((size_t)st.st_size + 1);
	if (!mem) {
		close(fd);
		return -2;
	}
	read_so_far = 0;
#ifdef _WIN32
#define N_TO_READ(x) ((x) > INT_MAX) ? INT_MAX : ((int)(x))
#else
#define N_TO_READ(x) (x)
#endif
	while ((r = read(fd, mem+read_so_far, N_TO_READ(st.st_size - read_so_far))) > 0) {
		read_so_far += r;
		if (read_so_far >= (size_t)st.st_size)
			break;
		EVUTIL_ASSERT(read_so_far < (size_t)st.st_size);
	}
	close(fd);
	if (r < 0) {
		mm_free(mem);
		return -2;
	}
	mem[read_so_far] = 0;

	*len_out = read_so_far;
	*content_out = mem;
	return 0;
}